

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_> *
chatra::filterNativeMethods
          (vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>
           *__return_storage_ptr__,StringTable *sTable,
          vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
          *handlers,StringId sidClass)

{
  bool bVar1;
  StringId SVar2;
  RuntimeException *anon_var_0;
  StringId local_58 [4];
  reference local_48;
  NativeCallHandlerInfo *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *__range1;
  StringId sidClass_local;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
  *handlers_local;
  StringTable *sTable_local;
  vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_> *ret;
  
  std::vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>::vector
            (__return_storage_ptr__);
  __end1 = std::
           vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
           begin(handlers);
  e = (NativeCallHandlerInfo *)
      std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
      end(handlers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_chatra::NativeCallHandlerInfo_*,_std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>_>
                                     *)&e), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_chatra::NativeCallHandlerInfo_*,_std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>_>
               ::operator*(&__end1);
    SVar2 = getStringIdOrThrow(sTable,&local_48->className);
    if (sidClass == SVar2) {
      local_58[0] = getStringIdOrThrow(sTable,&local_48->name);
      anon_var_0._4_4_ = getStringIdOrThrow(sTable,&local_48->subName);
      std::vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>>::
      emplace_back<chatra::StringId,chatra::StringId,void(&)(void(*)(chatra::NativeCallContext&),chatra::Thread&,chatra::ObjectBase*,chatra::StringId,chatra::StringId,chatra::Tuple&,chatra::Reference),void(*const&)(chatra::NativeCallContext&)>
                ((vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>> *)
                 __return_storage_ptr__,local_58,(StringId *)((long)&anon_var_0 + 4),nativeCall,
                 &local_48->handler);
    }
    __gnu_cxx::
    __normal_iterator<const_chatra::NativeCallHandlerInfo_*,_std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<NativeMethod> filterNativeMethods(
		const StringTable* sTable, const std::vector<NativeCallHandlerInfo>& handlers, StringId sidClass = StringId::Invalid) {

	std::vector<NativeMethod> ret;
	for (auto& e : handlers) {
		try {
			if (sidClass == getStringIdOrThrow(sTable, e.className)) {
				ret.emplace_back(getStringIdOrThrow(sTable, e.name), getStringIdOrThrow(sTable, e.subName),
						nativeCall, e.handler);
			}
		}
		catch (RuntimeException&) {
			// do nothing
		}
	}
	return ret;
}